

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testmap.cpp
# Opt level: O2

int map_height_proc(Am_Object *self)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Am_Value *pAVar4;
  
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)self,(ulong)STAGGER);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar4);
  if (bVar1) {
    pAVar4 = (Am_Value *)Am_Object::Get((ushort)self,0x85);
    uVar2 = Am_Value::operator_cast_to_int(pAVar4);
    iVar3 = 0x23;
    if ((uVar2 & 1) == 0) {
      iVar3 = 0x19;
    }
  }
  else {
    iVar3 = 0x1e;
  }
  return iVar3;
}

Assistant:

Am_Define_Formula(int, map_height)
{
  if ((bool)self.Get(STAGGER)) {
    int rank = self.Get(Am_RANK);
    if (rank % 2)
      return 35;
    else
      return 25;
  } else
    return 30;
}